

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O3

void __thiscall iutest::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  pointer __src;
  TestSuite *pTVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  
  ppTVar2 = (this->m_testsuites).
            super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppTVar3 = (this->m_testsuites).
            super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (ppTVar3 != ppTVar2) {
    pTVar1 = *ppTVar3;
    __src = ppTVar3 + 1;
    if (__src != ppTVar2) {
      memmove(ppTVar3,__src,(long)ppTVar2 - (long)__src);
      ppTVar2 = (this->m_testsuites).
                super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    ppTVar2 = ppTVar2 + -1;
    (this->m_testsuites).
    super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar2;
    if (pTVar1 != (TestSuite *)0x0) {
      (*pTVar1->_vptr_TestSuite[1])(pTVar1);
      ppTVar2 = (this->m_testsuites).
                super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    ppTVar3 = (this->m_testsuites).
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>::~vector
            (&(this->m_ad_hoc_testresult).m_test_propertys);
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&(this->m_ad_hoc_testresult).m_test_part_results);
  ppTVar3 = (this->m_testsuites).
            super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar3 != (pointer)0x0) {
    operator_delete(ppTVar3,(long)(this->m_testsuites).
                                  super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar3
                   );
    return;
  }
  return;
}

Assistant:

~UnitTestImpl() { TerminateImpl(); }